

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QGestureEvent *gestureEvent)

{
  QDebug *pQVar1;
  QDebug *in_RSI;
  QGestureEvent *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QList<QGesture_*> *vec;
  QGestureEvent *this;
  char *in_stack_ffffffffffffffc8;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
  vec = (QList<QGesture_*> *)local_20;
  QDebug::QDebug((QDebug *)vec,pQVar1);
  QGestureEvent::gestures(in_RDI);
  pQVar1 = (QDebug *)(local_20 + 8);
  operator<<((QDebug *)this,vec);
  QDebug::operator<<(pQVar1,(char)((ulong)in_RDI >> 0x38));
  QDebug::~QDebug(pQVar1);
  QList<QGesture_*>::~QList((QList<QGesture_*> *)0x2fd697);
  QDebug::~QDebug((QDebug *)vec);
  QDebug::QDebug(pQVar1,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)(Stream *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QDebug operator<<(QDebug d, const QGestureEvent *gestureEvent)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QGestureEvent(" << gestureEvent->gestures() << ')';
    return d;
}